

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ProcessImpl(LocalAccessChainConvertPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  bool bVar3;
  Status SVar4;
  Instruction *ai;
  Instruction *pIVar5;
  Status SVar6;
  pointer puVar7;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar5 = *(Instruction **)
                 ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      pIVar5 != (Instruction *)
                ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
      ; pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if (pIVar5->opcode_ == OpGroupDecorate) {
      return SuccessWithoutChange;
    }
  }
  bVar3 = AllExtensionsSupported(this);
  SVar6 = SuccessWithoutChange;
  if (bVar3) {
    pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar2 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
    for (puVar7 = *(pointer *)
                   &(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    ._M_impl; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      SVar4 = ConvertLocalAccessChains
                        (this,(Function *)
                              (puVar7->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                        );
      if ((int)SVar4 < (int)SVar6) {
        SVar6 = SVar4;
      }
      if (SVar6 == Failure) {
        return Failure;
      }
    }
  }
  return SVar6;
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ProcessImpl() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Do not process if any disallowed extensions are enabled
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;

  // Process all functions in the module.
  Status status = Status::SuccessWithoutChange;
  for (Function& func : *get_module()) {
    status = CombineStatus(status, ConvertLocalAccessChains(&func));
    if (status == Status::Failure) {
      break;
    }
  }
  return status;
}